

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O0

void Abc_NtkVerifyUsingBdds
               (Abc_Ntk_t *pNtk,int nBddMax,int nIterMax,int fPartition,int fReorder,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Abc_Obj_t *pAVar3;
  DdManager *dd_00;
  DdNode *n;
  DdNode **pbParts_00;
  DdNode *n_00;
  DdNode *n_01;
  abctime aVar4;
  abctime clk;
  int i;
  DdNode *bInitial;
  DdNode *bReached;
  DdNode *bOutput;
  DdNode **pbParts;
  DdManager *dd;
  int fVerbose_local;
  int fReorder_local;
  int fPartition_local;
  int nIterMax_local;
  int nBddMax_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10d,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  if (iVar1 != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10e,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  pAVar3 = Abc_NtkPo(pNtk,0);
  iVar1 = Abc_ObjFanoutNum(pAVar3);
  if (iVar1 != 0) {
    __assert_fail("Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10f,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  dd_00 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,nBddMax,1,fReorder,fVerbose);
  if (dd_00 == (DdManager *)0x0) {
    printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",(ulong)(uint)nBddMax);
  }
  else {
    if (fVerbose != 0) {
      Cudd_ReadKeys(dd_00);
      Cudd_ReadDead(dd_00);
      printf("Shared BDD size is %6d nodes.\n");
    }
    pAVar3 = Abc_NtkPo(pNtk,0);
    n = (DdNode *)Abc_ObjGlobalBdd(pAVar3);
    Cudd_Ref(n);
    pbParts_00 = Abc_NtkCreatePartitions(dd_00,pNtk,fReorder,fVerbose);
    n_00 = Abc_NtkInitStateVarMap(dd_00,pNtk,fVerbose);
    Cudd_Ref(n_00);
    iVar1 = Cudd_bddLeq(dd_00,n_00,(DdNode *)((ulong)n ^ 1));
    if (iVar1 == 0) {
      printf("The miter is proved REACHABLE in the initial state.  ");
    }
    else {
      n_01 = Abc_NtkComputeReachable
                       (dd_00,pNtk,pbParts_00,n_00,n,nBddMax,nIterMax,fPartition,fReorder,fVerbose);
      if (n_01 != (DdNode *)0x0) {
        Cudd_Ref(n_01);
        Cudd_RecursiveDeref(dd_00,n_01);
      }
    }
    Cudd_RecursiveDeref(dd_00,n);
    Cudd_RecursiveDeref(dd_00,n_00);
    for (clk._4_4_ = 0; iVar1 = Abc_NtkLatchNum(pNtk), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
    {
      Cudd_RecursiveDeref(dd_00,pbParts_00[clk._4_4_]);
    }
    if (pbParts_00 != (DdNode **)0x0) {
      free(pbParts_00);
    }
    Extra_StopManager(dd_00);
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Abc_NtkVerifyUsingBdds( Abc_Ntk_t * pNtk, int nBddMax, int nIterMax, int fPartition, int fReorder, int fVerbose )
{
    DdManager * dd;
    DdNode ** pbParts;
    DdNode * bOutput, * bReached, * bInitial;
    int i;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0 ); // PO should go first

    // compute the global BDDs of the latches
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddMax, 1, fReorder, fVerbose );    
    if ( dd == NULL )
    {
        printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", nBddMax );
        return;
    }
    if ( fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // save the output BDD
    bOutput = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkPo(pNtk,0)); Cudd_Ref( bOutput );

    // create partitions
    pbParts = Abc_NtkCreatePartitions( dd, pNtk, fReorder, fVerbose );

    // create the initial state and the variable map
    bInitial  = Abc_NtkInitStateVarMap( dd, pNtk, fVerbose );  Cudd_Ref( bInitial );

    // check the result
    if ( !Cudd_bddLeq( dd, bInitial, Cudd_Not(bOutput) ) )
        printf( "The miter is proved REACHABLE in the initial state.  " );
    else
    {
        // compute the reachable states
        bReached = Abc_NtkComputeReachable( dd, pNtk, pbParts, bInitial, bOutput, nBddMax, nIterMax, fPartition, fReorder, fVerbose ); 
        if ( bReached != NULL )
        {
            Cudd_Ref( bReached );
            Cudd_RecursiveDeref( dd, bReached );
        }
    }

    // cleanup
    Cudd_RecursiveDeref( dd, bOutput );
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    Extra_StopManager( dd );

    // report the runtime
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
}